

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_nearest_xyz(REF_NODE ref_node,REF_DBL *xyz,REF_INT *closest_node,REF_DBL *distance)

{
  REF_GLOB *pRVar1;
  REF_DBL *pRVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double __x;
  REF_DBL RVar6;
  double dVar7;
  
  *closest_node = -1;
  *distance = 1e+100;
  iVar3 = ref_node->max;
  if (iVar3 < 1) {
    __x = 1e+100;
  }
  else {
    pRVar1 = ref_node->global;
    __x = 1e+100;
    lVar4 = 2;
    lVar5 = 0;
    do {
      if (-1 < pRVar1[lVar5]) {
        pRVar2 = ref_node->real;
        dVar7 = (xyz[2] - pRVar2[lVar4]) * (xyz[2] - pRVar2[lVar4]) +
                (xyz[1] - pRVar2[lVar4 + -1]) * (xyz[1] - pRVar2[lVar4 + -1]) +
                (*xyz - pRVar2[lVar4 + -2]) * (*xyz - pRVar2[lVar4 + -2]);
        if (dVar7 < __x) {
          *closest_node = (REF_INT)lVar5;
          *distance = dVar7;
          iVar3 = ref_node->max;
          __x = dVar7;
        }
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xf;
    } while (lVar5 < iVar3);
  }
  if (__x < 0.0) {
    RVar6 = sqrt(__x);
  }
  else {
    RVar6 = SQRT(__x);
  }
  *distance = RVar6;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_nearest_xyz(REF_NODE ref_node, REF_DBL *xyz,
                                        REF_INT *closest_node,
                                        REF_DBL *distance) {
  REF_INT node;
  REF_DBL dist;
  *closest_node = REF_EMPTY;
  *distance = 1.0e100;
  each_ref_node_valid_node(ref_node, node) {
    dist = pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
           pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
           pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2);
    if (dist < *distance) {
      *closest_node = node;
      *distance = dist;
    }
  }
  *distance = sqrt(*distance);
  return REF_SUCCESS;
}